

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cc
# Opt level: O2

void __thiscall kratos::PassManager::add_pass(PassManager *this,string *name)

{
  bool bVar1;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view format_str;
  format_args args;
  string local_48;
  pointer local_28;
  size_type sStack_20;
  
  bVar1 = has_pass(this,name);
  if (bVar1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(this + 0x30),
               name);
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_28 = (name->_M_dataplus)._M_p;
  sStack_20 = name->_M_string_length;
  bVar2 = fmt::v7::to_string_view<char,_0>("{0} doesn\'t exists in the pass manager");
  format_str.data_ = (char *)bVar2.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_28;
  fmt::v7::detail::vformat_abi_cxx11_(&local_48,(detail *)bVar2.data_,format_str,args);
  UserException::UserException(this_00,&local_48);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PassManager::add_pass(const std::string& name) {
    if (!has_pass(name))
        throw UserException(::format("{0} doesn't exists in the pass manager", name));
    passes_order_.emplace_back(name);
}